

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O2

bool __thiscall ThreadRegion::removePredecessor(ThreadRegion *this,ThreadRegion *predecessor)

{
  size_type sVar1;
  bool bVar2;
  ThreadRegion *local_20;
  ThreadRegion *local_18;
  
  if (predecessor == (ThreadRegion *)0x0) {
    bVar2 = false;
  }
  else {
    local_20 = predecessor;
    std::
    _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
    ::erase(&(this->predecessors_)._M_t,&local_20);
    local_18 = this;
    sVar1 = std::
            _Rb_tree<ThreadRegion_*,_ThreadRegion_*,_std::_Identity<ThreadRegion_*>,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
            ::erase(&(local_20->successors_)._M_t,&local_18);
    bVar2 = sVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool ThreadRegion::removePredecessor(ThreadRegion *predecessor) {
    if (!predecessor) {
        return false;
    }
    predecessors_.erase(predecessor);
    return predecessor->successors_.erase(this);
}